

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::i2p_connection::
async_name_lookup<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>>
          (i2p_connection *this,char *name,
          _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_char_*)>
          *handler)

{
  bool bVar1;
  allocator<char> local_69;
  string local_68;
  _Bind<void_(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_char_*)>
  local_48;
  
  if ((this->m_state == sam_idle) &&
     ((this->m_name_lookup).
      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->m_name_lookup)) {
    bVar1 = is_open(this);
    if (bVar1) {
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_69);
      local_48._M_f = handler->_M_f;
      local_48._8_8_ = *(undefined8 *)&handler->field_0x8;
      local_48._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (handler->_M_bound_args).
           super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
           .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
           _M_head_impl.
           super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (handler->_M_bound_args).
              super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
              .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>.
              _M_head_impl.
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      (handler->_M_bound_args).
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (handler->_M_bound_args).
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      do_name_lookup<std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>>
                (this,&local_68,&local_48);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_48._M_bound_args.
                         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                         .
                         super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::http_connection>,_false>
                         ._M_head_impl.
                         super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                 + 8));
      goto LAB_001bd22d;
    }
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_69);
  ::std::__cxx11::
  list<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>,std::allocator<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>>>
  ::
  emplace_back<std::__cxx11::string,std::_Bind<void(libtorrent::aux::http_connection::*(std::shared_ptr<libtorrent::aux::http_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,char_const*)>>
            ((list<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>,std::allocator<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>>>
              *)&this->m_name_lookup,&local_68,handler);
LAB_001bd22d:
  ::std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void async_name_lookup(char const* name, Handler handler)
	{
		if (m_state == sam_idle && m_name_lookup.empty() && is_open())
			do_name_lookup(name, std::move(handler));
		else
			m_name_lookup.emplace_back(std::string(name)
				, std::move(handler));
	}